

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSIdent_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field,bool is_upper_camel,bool is_map,bool drop_list)

{
  bool bVar1;
  Type TVar2;
  Descriptor *pDVar3;
  undefined7 extraout_var;
  string *psVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_68;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TVar2 = FieldDescriptor::type((FieldDescriptor *)this);
  if (TVar2 == TYPE_GROUP) {
    if ((char)options == '\0') {
      pDVar3 = FieldDescriptor::message_type((FieldDescriptor *)this);
      anon_unknown_0::ParseUpperCamel(&vStack_68,*(string **)pDVar3);
      anon_unknown_0::ToLowerCamel(&local_50,&vStack_68);
    }
    else {
      pDVar3 = FieldDescriptor::message_type((FieldDescriptor *)this);
      anon_unknown_0::ParseUpperCamel(&vStack_68,*(string **)pDVar3);
      anon_unknown_0::ToUpperCamel(&local_50,&vStack_68);
    }
  }
  else if ((char)options == '\0') {
    anon_unknown_0::ParseLowerUnderscore(&vStack_68,*(string **)this);
    anon_unknown_0::ToLowerCamel(&local_50,&vStack_68);
  }
  else {
    anon_unknown_0::ParseLowerUnderscore(&vStack_68,*(string **)this);
    anon_unknown_0::ToUpperCamel(&local_50,&vStack_68);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_68);
  bVar1 = FieldDescriptor::is_map((FieldDescriptor *)this);
  psVar4 = (string *)CONCAT71(extraout_var,bVar1);
  if ((bVar1) || (((char)field == '\0' && (*(int *)(this + 0x4c) == 3)))) {
    psVar4 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return psVar4;
}

Assistant:

string JSIdent(const GeneratorOptions& options, const FieldDescriptor* field,
               bool is_upper_camel, bool is_map, bool drop_list) {
  string result;
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    result = is_upper_camel ?
        ToUpperCamel(ParseUpperCamel(field->message_type()->name())) :
        ToLowerCamel(ParseUpperCamel(field->message_type()->name()));
  } else {
    result = is_upper_camel ?
        ToUpperCamel(ParseLowerUnderscore(field->name())) :
        ToLowerCamel(ParseLowerUnderscore(field->name()));
  }
  if (is_map || IsMap(options, field)) {
    // JSPB-style or proto3-style map.
    result += "Map";
  } else if (!drop_list && field->is_repeated()) {
    // Repeated field.
    result += "List";
  }
  return result;
}